

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O3

void * large_ralloc(tsdn_t *tsdn,arena_t *arena,void *ptr,size_t usize,size_t alignment,_Bool zero,
                   tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  void *ptr_00;
  ulong uVar5;
  undefined8 uVar6;
  cache_bin_info_t *pcVar7;
  _Bool _Var8;
  szind_t binind;
  ulong uVar9;
  rtree_leaf_elm_t *prVar10;
  void *result;
  size_t alignment_00;
  ulong uVar11;
  rtree_ctx_t *prVar12;
  long lVar13;
  uint uVar14;
  extent_t *extent;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    prVar12 = &rtree_ctx_fallback;
    rtree_ctx_data_init(prVar12);
  }
  else {
    prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar9 = (ulong)ptr & 0xffffffffc0000000;
  uVar11 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&prVar12->cache[0].leafkey + uVar11);
  uVar11 = *(ulong *)((long)&prVar12->cache[0].leafkey + uVar11);
  if (uVar11 == uVar9) {
    prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (prVar12->l2_cache[0].leafkey == uVar9) {
    prVar10 = prVar12->l2_cache[0].leaf;
    prVar12->l2_cache[0].leafkey = uVar11;
    prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar9;
    puVar1[1] = (ulong)prVar10;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar13 = 0x118;
    do {
      if (*(ulong *)((long)prVar12->cache + lVar13 + -8) == uVar9) {
        uVar5 = *(ulong *)((long)&prVar12->cache[0].leafkey + lVar13);
        puVar2 = (undefined8 *)((long)prVar12->cache + lVar13 + -0x18);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)((long)prVar12->cache + lVar13 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        *(ulong *)((long)prVar12->cache + lVar13 + -0x18) = uVar11;
        *(ulong *)((long)(prVar12->cache + -1) + lVar13) = puVar1[1];
        *puVar1 = uVar9;
        puVar1[1] = uVar5;
        prVar10 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar5);
        goto LAB_001142fa;
      }
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x188);
    prVar10 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,prVar12,(uintptr_t)ptr,true,false);
  }
LAB_001142fa:
  extent = (extent_t *)(((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  uVar11 = *(ulong *)((long)sz_index2size_tab + (ulong)((uint)extent->e_bits >> 0xf & 0x7f8));
  _Var8 = large_ralloc_no_move(tsdn,extent,usize,usize,zero);
  if (!_Var8) {
    hook_invoke_expand(hook_args->is_realloc ^ hook_expand_rallocx,ptr,uVar11,usize,(uintptr_t)ptr,
                       hook_args->args);
    return extent->e_addr;
  }
  alignment_00 = 0x40;
  if (0x40 < alignment) {
    alignment_00 = alignment;
  }
  result = large_palloc(tsdn,arena,usize,alignment_00,zero);
  if (result == (void *)0x0) {
    return (void *)0x0;
  }
  hook_invoke_alloc(hook_alloc_rallocx - hook_args->is_realloc,result,(uintptr_t)result,
                    hook_args->args);
  hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (uVar11 < usize) {
    usize = uVar11;
  }
  memcpy(result,extent->e_addr,usize);
  ptr_00 = extent->e_addr;
  if (tcache == (tcache_t *)0x0) {
    arena_sdalloc_no_tcache(tsdn,ptr_00,uVar11);
    return result;
  }
  if (uVar11 < 0x1001) {
    binind = (szind_t)sz_size2index_tab[uVar11 + 7 >> 3];
  }
  else {
    binind = sz_size2index_compute(uVar11);
  }
  if (0x23 < binind) {
    if (nhbins <= binind) {
      if (tsdn == (tsdn_t *)0x0) {
        prVar12 = &rtree_ctx_fallback;
        rtree_ctx_data_init(prVar12);
      }
      else {
        prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      uVar9 = (ulong)ptr_00 & 0xffffffffc0000000;
      uVar11 = (ulong)(((uint)((ulong)ptr_00 >> 0x1e) & 0xf) << 4);
      puVar1 = (ulong *)((long)&prVar12->cache[0].leafkey + uVar11);
      uVar11 = *(ulong *)((long)&prVar12->cache[0].leafkey + uVar11);
      if (uVar11 == uVar9) {
        prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr_00 >> 9) & 0x1ffff8) + puVar1[1]);
      }
      else if (prVar12->l2_cache[0].leafkey == uVar9) {
        prVar10 = prVar12->l2_cache[0].leaf;
        prVar12->l2_cache[0].leafkey = uVar11;
        prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
        *puVar1 = uVar9;
        puVar1[1] = (ulong)prVar10;
        prVar10 = (rtree_leaf_elm_t *)
                  ((long)&(prVar10->le_bits).repr + (ulong)((uint)ptr_00 >> 9 & 0x1ffff8));
      }
      else {
        lVar13 = 0x118;
        do {
          if (*(ulong *)((long)prVar12->cache + lVar13 + -8) == uVar9) {
            uVar5 = *(ulong *)((long)&prVar12->cache[0].leafkey + lVar13);
            puVar2 = (undefined8 *)((long)prVar12->cache + lVar13 + -0x18);
            uVar6 = puVar2[1];
            puVar3 = (undefined8 *)((long)prVar12->cache + lVar13 + -8);
            *puVar3 = *puVar2;
            puVar3[1] = uVar6;
            *(ulong *)((long)prVar12->cache + lVar13 + -0x18) = uVar11;
            *(ulong *)((long)(prVar12->cache + -1) + lVar13) = puVar1[1];
            *puVar1 = uVar9;
            puVar1[1] = uVar5;
            prVar10 = (rtree_leaf_elm_t *)(((uint)ptr_00 >> 9 & 0x1ffff8) + uVar5);
            goto LAB_00114667;
          }
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0x188);
        prVar10 = rtree_leaf_elm_lookup_hard
                            (tsdn,&extents_rtree,prVar12,(uintptr_t)ptr_00,true,false);
      }
LAB_00114667:
      large_dalloc(tsdn,(extent_t *)
                        (((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe));
      return result;
    }
    if (opt_junk_free == true) {
      memset(ptr_00,0x5a,sz_index2size_tab[binind]);
    }
    uVar14 = tcache->bins_small[(ulong)binind + 5].ncached;
    if (uVar14 == tcache_bin_info[binind].ncached_max) {
      tcache_bin_flush_large
                (&tsdn->tsd,tcache->bins_small + (ulong)binind + 5,binind,(int)uVar14 >> 1,tcache);
      uVar14 = tcache->bins_small[(ulong)binind + 5].ncached;
    }
    tcache->bins_small[(ulong)binind + 5].ncached = uVar14 + 1;
    tcache->bins_small[(ulong)binind + 5].avail[(int)~uVar14] = ptr_00;
    iVar4 = (tcache->gc_ticker).tick;
    (tcache->gc_ticker).tick = iVar4 + -1;
    if (0 < iVar4) {
      return result;
    }
    (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
    goto LAB_001144a3;
  }
  if (opt_junk_free != false) {
    arena_dalloc_junk_small_impl(ptr_00,bin_infos + binind);
  }
  pcVar7 = tcache_bin_info;
  uVar14 = tcache->bins_small[binind].ncached;
  if (uVar14 == tcache_bin_info[binind].ncached_max) {
    tcache_bin_flush_small(&tsdn->tsd,tcache,tcache->bins_small + binind,binind,(int)uVar14 >> 1);
    uVar14 = tcache->bins_small[binind].ncached;
    if (uVar14 != pcVar7[binind].ncached_max) goto LAB_00114473;
  }
  else {
LAB_00114473:
    tcache->bins_small[binind].ncached = uVar14 + 1;
    tcache->bins_small[binind].avail[(int)~uVar14] = ptr_00;
  }
  iVar4 = (tcache->gc_ticker).tick;
  (tcache->gc_ticker).tick = iVar4 + -1;
  if (0 < iVar4) {
    return result;
  }
  (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
LAB_001144a3:
  tcache_event_hard(&tsdn->tsd,tcache);
  return result;
}

Assistant:

void *
large_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t usize,
    size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	extent_t *extent = iealloc(tsdn, ptr);

	size_t oldusize = extent_usize_get(extent);
	/* The following should have been caught by callers. */
	assert(usize > 0 && usize <= SC_LARGE_MAXCLASS);
	/* Both allocation sizes must be large to avoid a move. */
	assert(oldusize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS);

	/* Try to avoid moving the allocation. */
	if (!large_ralloc_no_move(tsdn, extent, usize, usize, zero)) {
		hook_invoke_expand(hook_args->is_realloc
		    ? hook_expand_realloc : hook_expand_rallocx, ptr, oldusize,
		    usize, (uintptr_t)ptr, hook_args->args);
		return extent_addr_get(extent);
	}

	/*
	 * usize and old size are different enough that we need to use a
	 * different size class.  In that case, fall back to allocating new
	 * space and copying.
	 */
	void *ret = large_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	size_t copysize = (usize < oldusize) ? usize : oldusize;
	memcpy(ret, extent_addr_get(extent), copysize);
	isdalloct(tsdn, extent_addr_get(extent), oldusize, tcache, NULL, true);
	return ret;
}